

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O2

void mwTrace(char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list mark;
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  mwAutoInit();
  if (mwTestAlways != 0) {
    mwTestNow((char *)0x0,0,1);
  }
  if (mwOutFunction == (_func_void_int *)0x0) {
    mwOutFunction = mwDefaultOutFunc;
  }
  mark[0].reg_save_area = local_c8;
  mark[0].overflow_arg_area = &stack0x00000008;
  mark[0].gp_offset = 8;
  mark[0].fp_offset = 0x30;
  pcVar2 = mwPrintBuf;
  iVar1 = vsprintf(mwPrintBuf,format,mark);
  if (0x7ff < iVar1) {
    mwPrintBuf[0x800] = '\0';
  }
  for (; *pcVar2 != 0; pcVar2 = pcVar2 + 1) {
    (*mwOutFunction)((int)*pcVar2);
  }
  if (0x7ff < iVar1) {
    mwIncErr();
    mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
  }
  mwFlush();
  return;
}

Assistant:

void mwTrace(const char *format, ...)
{
	int tot, oflow = 0;
	va_list mark;

	mwAutoInit();
	MW_MUTEX_LOCK();
	TESTS(NULL, 0);
	if (mwOutFunction == NULL) {
		mwOutFunction = mwDefaultOutFunc;
	}

	va_start(mark, format);
	tot = vsprintf(mwPrintBuf, format, mark);
	va_end(mark);
	if (tot >= MW_TRACE_BUFFER) {
		mwPrintBuf[MW_TRACE_BUFFER] = 0;
		oflow = 1;
	}
	for (tot = 0; mwPrintBuf[tot]; tot++) {
		(*mwOutFunction)(mwPrintBuf[tot]);
	}
	if (oflow) {
		mwIncErr();
		mwTrace(" [WARNING: OUTPUT BUFFER OVERFLOW - SYSTEM UNSTABLE]\n");
	}

	FLUSH();
	MW_MUTEX_UNLOCK();
}